

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

void __thiscall Fossilize::DatabaseInterface::~DatabaseInterface(DatabaseInterface *this)

{
  Impl *this_00;
  
  this->_vptr_DatabaseInterface = (_func_int **)&PTR__DatabaseInterface_0016a8e0;
  this_00 = this->impl;
  if (this_00->mapped_metadata != (uint8_t *)0x0) {
    munmap(this_00->mapped_metadata,this_00->mapped_metadata_size);
    this_00 = this->impl;
    if (this_00 == (Impl *)0x0) {
      this_00 = (Impl *)0x0;
      goto LAB_00105064;
    }
  }
  Impl::~Impl(this_00);
LAB_00105064:
  operator_delete(this_00,0x290);
  return;
}

Assistant:

DatabaseInterface::~DatabaseInterface()
{
#ifdef _WIN32
	if (impl->mapped_metadata)
		UnmapViewOfFile(impl->mapped_metadata);
#else
	if (impl->mapped_metadata)
		munmap(const_cast<uint8_t *>(impl->mapped_metadata), impl->mapped_metadata_size);
#endif
	delete impl;
}